

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtParser.c
# Opt level: O0

nps_node_t NPSGenNode2(uint32_t code,nps_node_t op1,nps_node_t op2)

{
  _Bool _Var1;
  uint32_t *puVar2;
  nps_syntax_node_t *node;
  nps_node_t op2_local;
  nps_node_t op1_local;
  ulong uStack_10;
  uint32_t code_local;
  
  _Var1 = NewtStackExpand(&nps_stree,nps_stree.sp + 1);
  if (_Var1) {
    puVar2 = (uint32_t *)((long)nps_stree.stackp + (ulong)nps_stree.sp * 0x18);
    *puVar2 = code;
    *(nps_node_t *)(puVar2 + 2) = op1;
    *(nps_node_t *)(puVar2 + 4) = op2;
    uStack_10 = (ulong)(nps_stree.sp * 0x10 | 0xe);
    nps_stree.sp = nps_stree.sp + 1;
  }
  else {
    yyerror("Syntax tree overflow");
    uStack_10 = 0xffffffffffffffff;
  }
  return uStack_10;
}

Assistant:

nps_node_t NPSGenNode2(uint32_t code, nps_node_t op1, nps_node_t op2)
{
    nps_syntax_node_t *	node;
    
    if (! NewtStackExpand(&nps_stree, CX + 1))
    {
        yyerror("Syntax tree overflow");
        return -1;
    }
    
    node = &STREESTACK[CX];
    
    node->code = code;
    node->op1 = op1;
    node->op2 = op2;
    
    CX++;
    
    return NPSMakeSyntaxNode(CX - 1);
}